

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_SINCOS(Context *ctx)

{
  int iVar1;
  int iVar2;
  uint local_20;
  int i;
  int mask;
  DestArgInfo *dst;
  Context *ctx_local;
  
  iVar2 = (ctx->dest_arg).writemask;
  iVar1 = writemask_x(iVar2);
  if (((iVar1 == 0) && (iVar1 = writemask_y(iVar2), iVar1 == 0)) &&
     (iVar2 = writemask_xy(iVar2), iVar2 == 0)) {
    fail(ctx,"SINCOS write mask must be .x or .y or .xy");
  }
  else {
    iVar2 = replicate_swizzle(ctx->source_args[0].swizzle);
    if (iVar2 == 0) {
      fail(ctx,"SINCOS src0 must have replicate swizzle");
    }
    else if (((ctx->dest_arg).result_mod & 1U) == 0) {
      iVar2 = shader_version_atleast(ctx,'\x03','\0');
      if (iVar2 == 0) {
        for (local_20 = 1; (int)local_20 < 3; local_20 = local_20 + 1) {
          if (ctx->source_args[(int)local_20].regtype != REG_TYPE_CONST) {
            failf(ctx,"SINCOS src%d must be constfloat",(ulong)local_20);
            return;
          }
        }
        if (ctx->source_args[1].regnum == ctx->source_args[2].regnum) {
          fail(ctx,"SINCOS src1 and src2 must be different registers");
        }
      }
    }
    else {
      fail(ctx,"SINCOS destination can\'t use saturate modifier");
    }
  }
  return;
}

Assistant:

static void state_SINCOS(Context *ctx)
{
    const DestArgInfo *dst = &ctx->dest_arg;
    const int mask = dst->writemask;
    if (!writemask_x(mask) && !writemask_y(mask) && !writemask_xy(mask))
        fail(ctx, "SINCOS write mask must be .x or .y or .xy");

    else if (!replicate_swizzle(ctx->source_args[0].swizzle))
        fail(ctx, "SINCOS src0 must have replicate swizzle");

    else if (dst->result_mod & MOD_SATURATE)  // according to msdn...
        fail(ctx, "SINCOS destination can't use saturate modifier");

    // this opcode needs extra registers, with extra limitations, for <= sm2.
    else if (!shader_version_atleast(ctx, 3, 0))
    {
        int i;
        for (i = 1; i < 3; i++)
        {
            if (ctx->source_args[i].regtype != REG_TYPE_CONST)
            {
                failf(ctx, "SINCOS src%d must be constfloat", i);
                return;
            } // if
        } // for

        if (ctx->source_args[1].regnum == ctx->source_args[2].regnum)
            fail(ctx, "SINCOS src1 and src2 must be different registers");
    } // if
}